

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O2

LineSplitter * __thiscall Assimp::LineSplitter::operator++(LineSplitter *this)

{
  StreamReader<false,_false> *pSVar1;
  char cVar2;
  byte bVar3;
  logic_error *this_00;
  
  if (this->mSwallow == true) {
    this->mSwallow = false;
    return this;
  }
  if (*(int *)&this->mStream->end == *(int *)&this->mStream->current) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"End of file, no more lines to be retrieved.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (this->mCur)._M_string_length = 0;
  *(this->mCur)._M_dataplus._M_p = '\0';
  while (pSVar1 = this->mStream, *(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    cVar2 = StreamReader<false,_false>::Get<signed_char>(pSVar1);
    if ((cVar2 == '\r') || (cVar2 == '\n')) {
      if (this->mSkip_empty_lines == true) goto LAB_00410bfe;
      if ((cVar2 == '\r') &&
         ((pSVar1 = this->mStream, *(int *)&pSVar1->end != *(int *)&pSVar1->current &&
          (cVar2 = StreamReader<false,_false>::Get<signed_char>(pSVar1), cVar2 != '\n')))) {
        StreamReader<false,_false>::IncPtr(this->mStream,-1);
      }
      if (this->mTrim == true) goto LAB_00410c4c;
      break;
    }
    std::__cxx11::string::push_back((char)this + '\b');
  }
  goto LAB_00410c7d;
  while ((bVar3 = StreamReader<false,_false>::Get<signed_char>(pSVar1), bVar3 < 0x21 &&
         ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) != 0))) {
LAB_00410bfe:
    pSVar1 = this->mStream;
    if (*(int *)&pSVar1->end == *(int *)&pSVar1->current) goto LAB_00410c7d;
  }
  goto LAB_00410c69;
  while ((cVar2 = StreamReader<false,_false>::Get<signed_char>(pSVar1), cVar2 == '\t' ||
         (cVar2 == ' '))) {
LAB_00410c4c:
    pSVar1 = this->mStream;
    if (*(int *)&pSVar1->end == *(int *)&pSVar1->current) goto LAB_00410c7d;
  }
LAB_00410c69:
  pSVar1 = this->mStream;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    StreamReader<false,_false>::IncPtr(pSVar1,-1);
  }
LAB_00410c7d:
  this->mIdx = this->mIdx + 1;
  return this;
}

Assistant:

inline
LineSplitter& LineSplitter::operator++() {
    if (mSwallow) {
        mSwallow = false;
        return *this;
    }

    if (!*this) {
        throw std::logic_error("End of file, no more lines to be retrieved.");
    }

    char s;
    mCur.clear();
    while (mStream.GetRemainingSize() && (s = mStream.GetI1(), 1)) {
        if (s == '\n' || s == '\r') {
            if (mSkip_empty_lines) {
                while (mStream.GetRemainingSize() && ((s = mStream.GetI1()) == ' ' || s == '\r' || s == '\n'));
                if (mStream.GetRemainingSize()) {
                    mStream.IncPtr(-1);
                }
            } else {
                // skip both potential line terminators but don't read past this line.
                if (mStream.GetRemainingSize() && (s == '\r' && mStream.GetI1() != '\n')) {
                    mStream.IncPtr(-1);
                }
                if (mTrim) {
                    while (mStream.GetRemainingSize() && ((s = mStream.GetI1()) == ' ' || s == '\t'));
                    if (mStream.GetRemainingSize()) {
                        mStream.IncPtr(-1);
                    }
                }
            }
            break;
        }
        mCur += s;
    }
    ++mIdx;

    return *this;
}